

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

Test * __thiscall
testing::internal::ParameterizedTestFactory<(anonymous_namespace)::VectorVarTest_ZeroDiff_Test>::
CreateTest(ParameterizedTestFactory<(anonymous_namespace)::VectorVarTest_ZeroDiff_Test> *this)

{
  Test *this_00;
  long in_RDI;
  
  WithParamInterface<std::tuple<int,_int_(*)(const_short_*,_const_short_*,_int),_int_(*)(const_short_*,_const_short_*,_int)>_>
  ::SetParam((ParamType *)(in_RDI + 8));
  this_00 = (Test *)operator_new(0x48);
  anon_unknown.dwarf_fe241b::VectorVarTest_ZeroDiff_Test::VectorVarTest_ZeroDiff_Test
            ((VectorVarTest_ZeroDiff_Test *)this_00);
  return this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }